

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_genc.cpp
# Opt level: O0

UBool checkAssemblyHeaderName(char *optAssembly)

{
  int iVar1;
  int local_1c;
  int32_t idx;
  char *optAssembly_local;
  
  assemblyHeaderIndex = -1;
  local_1c = 0;
  while( true ) {
    if (9 < local_1c) {
      return '\0';
    }
    iVar1 = strcmp(optAssembly,assemblyHeader[local_1c].name);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  assemblyHeaderIndex = local_1c;
  hexType = (int)assemblyHeader[local_1c].hexType;
  return '\x01';
}

Assistant:

U_CAPI UBool U_EXPORT2
checkAssemblyHeaderName(const char* optAssembly) {
    int32_t idx;
    assemblyHeaderIndex = -1;
    for (idx = 0; idx < UPRV_LENGTHOF(assemblyHeader); idx++) {
        if (uprv_strcmp(optAssembly, assemblyHeader[idx].name) == 0) {
            assemblyHeaderIndex = idx;
            hexType = assemblyHeader[idx].hexType; /* set the hex type */
            return TRUE;
        }
    }

    return FALSE;
}